

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

void readQuantizationTable(ifstream *inFile,Header *header)

{
  QuantizationTable *pQVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  ostream *poVar7;
  ulong uVar8;
  uint i;
  long lVar9;
  bool bVar10;
  byte local_41;
  Header *local_40;
  QuantizationTable *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading DQT",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  iVar3 = std::istream::get();
  iVar4 = std::istream::get();
  iVar3 = iVar3 * 0x100 + iVar4 + -2;
  local_40 = header;
  if (0 < iVar3) {
    local_38 = header->quantizationTables;
    do {
      bVar2 = std::istream::get();
      pQVar1 = local_38;
      local_41 = bVar2 & 0xf;
      if ((bVar2 & 0xc) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"invaild quantizatio table ID:",0x1d);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_41,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        goto LAB_00102bc2;
      }
      uVar8 = (ulong)((uint)local_41 * 0x100 + (uint)local_41 * 4);
      (&local_38->set)[uVar8] = true;
      lVar9 = 0;
      if ((bVar2 & 0xf0) == 0) {
        do {
          uVar6 = std::istream::get();
          *(undefined4 *)((long)pQVar1->table + (ulong)""[lVar9] * 4 + uVar8) = uVar6;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x40);
        iVar4 = -0x41;
      }
      else {
        do {
          iVar4 = std::istream::get();
          iVar5 = std::istream::get();
          *(int *)((long)pQVar1->table + (ulong)""[lVar9] * 4 + uVar8) = iVar5 + iVar4 * 0x100;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x40);
        iVar4 = -0x81;
      }
      bVar10 = SCARRY4(iVar3,iVar4);
      iVar3 = iVar3 + iVar4;
    } while (iVar3 != 0 && bVar10 == iVar3 < 0);
  }
  if (iVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error -DQT invalid\n",0x13);
LAB_00102bc2:
    local_40->valid = false;
  }
  return;
}

Assistant:

void readQuantizationTable(std::ifstream& inFile, Header* const header) {
	std::cout << "Reading DQT" << std::endl;
	int length = (inFile.get() << 8) + inFile.get();
	length = length - 2;
	while (length > 0) {	
		byte tableInfo = inFile.get();
		byte tableSize = tableInfo >> 4;
		byte tableID = tableInfo & 0x0F;
		length = length - 1;

		//只能是 0 1 2 3 
		if (tableID > 3) {
			std::cout << "invaild quantizatio table ID:" << tableID << std::endl;
			header->valid = false;
			return;
		}

		header->quantizationTables[tableID].set = true;

		if (tableSize != 0) { //2bytes
			for (uint i = 0; i < 64; i++) {
				//文件中的数据是以zig_zag的顺序存储的，所以需要以zig_zag的顺序赋值。
				header->quantizationTables[tableID].table[ZIG_ZAG[i]] = (inFile.get() << 8) + inFile.get();
			}
			length = length - 128;
		} else {
			for (uint i = 0; i < 64; i++) {
				header->quantizationTables[tableID].table[ZIG_ZAG[i]] = inFile.get();
			}
			length = length - 64;
		}
	}

	if (length != 0) {
		std::cout << "Error -DQT invalid\n";
		header->valid = false;
	}
}